

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  Bitmask BVar1;
  Bitmask local_28;
  Bitmask mask;
  int i;
  ExprList *pList_local;
  WhereMaskSet *pMaskSet_local;
  
  local_28 = 0;
  if (pList != (ExprList *)0x0) {
    for (mask._4_4_ = 0; mask._4_4_ < pList->nExpr; mask._4_4_ = mask._4_4_ + 1) {
      BVar1 = sqlite3WhereExprUsage(pMaskSet,pList->a[mask._4_4_].pExpr);
      local_28 = BVar1 | local_28;
    }
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= sqlite3WhereExprUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}